

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm.h
# Opt level: O0

void ncnn::convolution_im2col_gemm_get_optimal_tile_mnk
               (int M,int N,int K,int *TILE_M,int *TILE_N,int *TILE_K,int nT)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int *in_R8;
  int *in_R9;
  int in_stack_00000008;
  int nn_N;
  int tile_size_1;
  int nn_M_1;
  int nn_M;
  int nn_K;
  int tile_size;
  int l2_cache_size_fp32;
  int local_7c;
  int local_78;
  int local_74;
  int local_70 [3];
  int local_64 [3];
  int local_58;
  int local_54;
  int local_50;
  int local_4c [3];
  int local_40;
  int local_3c;
  int local_38 [3];
  int local_2c;
  int *local_28;
  int *local_20;
  int *local_18;
  int local_c;
  int local_8;
  int local_4;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  iVar1 = get_cpu_level2_cache_size();
  local_2c = (int)((ulong)(long)iVar1 >> 2);
  if (in_stack_00000008 == 0) {
    in_stack_00000008 = get_physical_big_cpu_count();
  }
  local_38[2] = (local_2c + -0x20) / 8;
  local_38[1] = 8;
  local_38[0] = local_38[2] / 8 << 3;
  piVar2 = std::max<int>(local_38 + 1,local_38);
  *local_28 = *piVar2;
  local_3c = (local_c + *local_28 + -1) / *local_28;
  local_40 = ((local_c + local_3c + -1) / local_3c + 7) / 8 << 3;
  piVar2 = std::min<int>(local_28,&local_40);
  *local_28 = *piVar2;
  local_4c[2] = (local_4 + 0x1f) / 0x20;
  local_4c[1] = 8;
  local_4c[0] = ((local_4 + local_4c[2] + -1) / local_4c[2] + 7) / 8 << 3;
  piVar2 = std::max<int>(local_4c + 1,local_4c);
  *local_18 = *piVar2;
  local_50 = get_physical_cpu_count();
  piVar2 = std::min<int>(&stack0x00000008,&local_50);
  *local_18 = *piVar2 * *local_18;
  local_54 = (local_4 + *local_18 + -1) / *local_18;
  local_58 = ((local_4 + local_54 + -1) / local_54 + 7) / 8 << 3;
  piVar3 = std::min<int>(local_18,&local_58);
  piVar2 = local_18;
  *local_18 = *piVar3;
  if (1 < in_stack_00000008) {
    local_64[1] = 1;
    local_64[0] = *local_18 / in_stack_00000008;
    piVar3 = std::max<int>(local_64 + 1,local_64);
    local_64[2] = (*piVar3 + 7) / 8 << 3;
    piVar2 = std::min<int>(piVar2,local_64 + 2);
    *local_18 = *piVar2;
  }
  if (0 < local_8) {
    if (*local_28 < local_c) {
      local_70[2] = (local_2c - *local_18 * *local_28) / (*local_18 + *local_28);
    }
    else {
      local_70[2] = (local_2c - *local_18 * *local_28) / *local_28;
    }
    local_70[1] = 4;
    local_70[0] = local_70[2] / 4 << 2;
    piVar2 = std::max<int>(local_70 + 1,local_70);
    *local_20 = *piVar2;
    local_74 = (local_8 + *local_20 + -1) / *local_20;
    local_78 = ((local_8 + local_74 + -1) / local_74 + 3) / 4 << 2;
    piVar2 = std::min<int>(local_20,&local_78);
    *local_20 = *piVar2;
    local_7c = 4;
    piVar2 = std::max<int>(&local_7c,local_20);
    *local_20 = *piVar2;
  }
  return;
}

Assistant:

static void convolution_im2col_gemm_get_optimal_tile_mnk(int M, int N, int K, int& TILE_M, int& TILE_N, int& TILE_K, int nT)
{
    // resolve optimal tile size from cache size
    const int l2_cache_size_fp32 = (int)(get_cpu_level2_cache_size() / sizeof(float));

    if (nT == 0)
        nT = get_physical_big_cpu_count();

    // solve K
    {
        // try not to split K
#if __AVX512F__
        int tile_size = (l2_cache_size_fp32 - 64) / 16;
#elif __AVX__
        int tile_size = (l2_cache_size_fp32 - 32) / 8;
#elif __SSE2__
        int tile_size = (l2_cache_size_fp32 - 16) / 8;
#else
        int tile_size = (l2_cache_size_fp32 - 2) / 3;
#endif

#if __AVX512F__
        TILE_K = std::max(16, tile_size / 16 * 16);
#elif __AVX__
        TILE_K = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
        TILE_K = std::max(4, tile_size / 4 * 4);
#else
        TILE_K = std::max(2, tile_size / 2 * 2);
#endif

        int nn_K = (K + TILE_K - 1) / TILE_K;
#if __AVX512F__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 15) / 16 * 16);
#elif __AVX__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 7) / 8 * 8);
#elif __SSE2__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 3) / 4 * 4);
#else
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 1) / 2 * 2);
#endif
    }

    // solve M
    {
#if __AVX512F__
        int nn_M = (M + 63) / 64;
#elif __AVX__
        int nn_M = (M + 31) / 32;
#elif __SSE2__
        int nn_M = (M + 15) / 16;
#else
        int nn_M = (M + 7) / 8;
#endif

#if __AVX512F__
        TILE_M = std::max(16, ((M + nn_M - 1) / nn_M + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::max(8, ((M + nn_M - 1) / nn_M + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::max(4, ((M + nn_M - 1) / nn_M + 3) / 4 * 4);
#else
        TILE_M = std::max(2, ((M + nn_M - 1) / nn_M + 1) / 2 * 2);
#endif
    }

    {
        TILE_M *= std::min(nT, get_physical_cpu_count());

        int nn_M = (M + TILE_M - 1) / TILE_M;
#if __AVX512F__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 3) / 4 * 4);
#else
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 1) / 2 * 2);
#endif

        if (nT > 1)
        {
#if __AVX512F__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 15) / 16 * 16);
#elif __AVX__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 7) / 8 * 8);
#elif __SSE2__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 3) / 4 * 4);
#else
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 1) / 2 * 2);
#endif
        }
    }

    if (N > 0)
    {
        int tile_size;
        if (TILE_K >= K)
        {
            tile_size = (l2_cache_size_fp32 - TILE_M * TILE_K) / TILE_K;
        }
        else
        {
            tile_size = (l2_cache_size_fp32 - TILE_M * TILE_K) / (TILE_M + TILE_K);
        }

#if __AVX512F__
        TILE_N = std::max(4, tile_size / 4 * 4);
#elif __AVX__
        TILE_N = std::max(4, tile_size / 4 * 4);
#elif __SSE2__
        TILE_N = std::max(4, tile_size / 4 * 4);
#else
        TILE_N = std::max(1, tile_size);
#endif

        int nn_N = (N + TILE_N - 1) / TILE_N;
#if __AVX512F__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __AVX__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __SSE2__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#else
        TILE_N = std::min(TILE_N, (N + nn_N - 1) / nn_N);
#endif

#if __AVX512F__
        TILE_N = std::max(4, TILE_N);
#elif __AVX__
        TILE_N = std::max(4, TILE_N);
#elif __SSE2__
        TILE_N = std::max(4, TILE_N);
#else
        TILE_N = std::max(1, TILE_N);
#endif
    }
}